

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnTableGrowExpr(BinaryReaderIR *this,Index table_index)

{
  Result RVar1;
  pointer *__ptr;
  Expr *local_98;
  _Head_base<0UL,_wabt::Expr_*,_false> local_90;
  Location local_88;
  Var local_60;
  
  local_88.field_1.field_0.line = 0;
  local_88.field_1._4_8_ = 0;
  local_88.filename.data_ = (char *)0x0;
  local_88.filename.size_._0_4_ = 0;
  local_88.filename.size_._4_4_ = 0;
  Var::Var(&local_60,table_index,&local_88);
  MakeUnique<wabt::VarExpr<(wabt::ExprType)50>,wabt::Var>((wabt *)&local_98,&local_60);
  local_90._M_head_impl = local_98;
  local_98 = (Expr *)0x0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_90);
  if (local_90._M_head_impl != (Expr *)0x0) {
    (*(local_90._M_head_impl)->_vptr_Expr[1])();
  }
  if (local_98 != (Expr *)0x0) {
    (**(code **)(*(long *)local_98 + 8))();
  }
  local_98 = (Expr *)0x0;
  Var::~Var(&local_60);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnTableGrowExpr(Index table_index) {
  return AppendExpr(MakeUnique<TableGrowExpr>(Var(table_index)));
}